

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

void Llb_Nonlin4Free(Llb_Mgr_t_conflict *p)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < p->nVars; lVar1 = lVar1 + 1) {
    if (p->pVars[lVar1] != (Llb_Var_t *)0x0) {
      Llb_Nonlin4RemoveVar(p,p->pVars[lVar1]);
    }
  }
  for (lVar1 = 0; lVar1 < p->iPartFree; lVar1 = lVar1 + 1) {
    if (p->pParts[lVar1] != (Llb_Prt_t *)0x0) {
      Llb_Nonlin4RemovePart(p,p->pParts[lVar1]);
    }
  }
  if (p->pVars != (Llb_Var_t **)0x0) {
    free(p->pVars);
    p->pVars = (Llb_Var_t **)0x0;
  }
  if (p->pParts != (Llb_Prt_t **)0x0) {
    free(p->pParts);
    p->pParts = (Llb_Prt_t **)0x0;
  }
  free(p->pSupp);
  free(p);
  return;
}

Assistant:

void Llb_Nonlin4Free( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i;
    Llb_MgrForEachVar( p, pVar, i )
        Llb_Nonlin4RemoveVar( p, pVar );
    Llb_MgrForEachPart( p, pPart, i )
        Llb_Nonlin4RemovePart( p, pPart );
    ABC_FREE( p->pVars );
    ABC_FREE( p->pParts );
    ABC_FREE( p->pSupp );
    ABC_FREE( p );
}